

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocketsphinx.c
# Opt level: O2

ps_nbest_t * ps_nbest_next(ps_nbest_t *nbest)

{
  ps_latpath_t *ppVar1;
  
  ppVar1 = ps_astar_next(nbest);
  if (ppVar1 == (ps_latpath_t *)0x0) {
    ps_astar_finish(nbest);
    nbest = (ps_nbest_t *)0x0;
  }
  return nbest;
}

Assistant:

ps_nbest_t *
ps_nbest_next(ps_nbest_t *nbest)
{
    ps_latpath_t *next;

    next = ps_astar_next(nbest);
    if (next == NULL) {
        ps_nbest_free(nbest);
        return NULL;
    }
    return nbest;
}